

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

void Cba_BlastMultiplier2
               (Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits,Vec_Int_t *vTemp,Vec_Int_t *vRes)

{
  int Entry;
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  
  uVar2 = 0;
  Vec_IntFill(vRes,nBits,0);
  uVar1 = 0;
  if (0 < nBits) {
    uVar1 = (ulong)(uint)nBits;
  }
  while( true ) {
    if (uVar2 == uVar1) {
      return;
    }
    Vec_IntFill(vTemp,(int)uVar2,0);
    piVar3 = pArg0;
    while (vTemp->nSize < nBits) {
      Entry = Gia_ManHashAnd(pNew,*piVar3,pArg1[uVar2]);
      Vec_IntPush(vTemp,Entry);
      piVar3 = piVar3 + 1;
    }
    if (vTemp->nSize != nBits) break;
    Cba_BlastAdder(pNew,0,vRes->pArray,vTemp->pArray,nBits);
    uVar2 = uVar2 + 1;
  }
  __assert_fail("Vec_IntSize(vTemp) == nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                ,0x15e,
                "void Cba_BlastMultiplier2(Gia_Man_t *, int *, int *, int, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

void Cba_BlastMultiplier2( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits, Vec_Int_t * vTemp, Vec_Int_t * vRes )
{
    int i, j;
    Vec_IntFill( vRes, nBits, 0 );
    for ( i = 0; i < nBits; i++ )
    {
        Vec_IntFill( vTemp, i, 0 );
        for ( j = 0; Vec_IntSize(vTemp) < nBits; j++ )
            Vec_IntPush( vTemp, Gia_ManHashAnd(pNew, pArg0[j], pArg1[i]) );
        assert( Vec_IntSize(vTemp) == nBits );
        Cba_BlastAdder( pNew, 0, Vec_IntArray(vRes), Vec_IntArray(vTemp), nBits );
    }
}